

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall
ONX_ModelPrivate::CreateXMLFromRenderContent
          (ONX_ModelPrivate *this,ON_XMLNode *model_node,RenderContentKinds kind)

{
  bool bVar1;
  ON_RenderContent *pContent;
  ON_RenderContent *rc;
  ON_ModelComponent *local_88;
  ON_ModelComponent *component;
  ONX_ModelComponentIterator it;
  ON_XMLNode *rc_section_node;
  RenderContentKinds kind_local;
  ON_XMLNode *model_node_local;
  ONX_ModelPrivate *this_local;
  
  it.m_current_component_weak_ref.m_wp.
  super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       GetRenderContentSectionNode(this,model_node,kind);
  if ((ON_XMLNode *)
      it.m_current_component_weak_ref.m_wp.
      super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (ON_XMLNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    (*((ON_XMLNode *)
      it.m_current_component_weak_ref.m_wp.
      super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr_ON_XMLNode[0x12])();
    ONX_ModelComponentIterator::ONX_ModelComponentIterator
              ((ONX_ModelComponentIterator *)&component,this->m_model,RenderContent);
    local_88 = ONX_ModelComponentIterator::FirstComponent((ONX_ModelComponentIterator *)&component);
    while (local_88 != (ON_ModelComponent *)0x0) {
      pContent = ON_RenderContent::Cast(&local_88->super_ON_Object);
      if ((pContent != (ON_RenderContent *)0x0) && (bVar1 = ContentIsKind(pContent,kind), bVar1)) {
        SetRenderContentNodeRecursive
                  (pContent,(ON_XMLNode *)
                            it.m_current_component_weak_ref.m_wp.
                            super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
      }
      local_88 = ONX_ModelComponentIterator::NextComponent((ONX_ModelComponentIterator *)&component)
      ;
    }
    this_local._7_1_ = true;
    ONX_ModelComponentIterator::~ONX_ModelComponentIterator
              ((ONX_ModelComponentIterator *)&component);
  }
  return this_local._7_1_;
}

Assistant:

bool ONX_ModelPrivate::CreateXMLFromRenderContent(ON_XMLNode& model_node, RenderContentKinds kind) const
{
  ON_XMLNode* rc_section_node = GetRenderContentSectionNode(model_node, kind);
  if (nullptr == rc_section_node)
    return false;

  rc_section_node->RemoveAllChildren();

  ONX_ModelComponentIterator it(m_model, ON_ModelComponent::Type::RenderContent);
  const ON_ModelComponent* component = it.FirstComponent();
  while (nullptr != component)
  {
    const auto* rc = ON_RenderContent::Cast(component);
    if (nullptr != rc)
    {
      if (ContentIsKind(rc, kind))
      {
        SetRenderContentNodeRecursive(*rc, *rc_section_node);
      }
    }

    component = it.NextComponent();
  }

  return true;
}